

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BorderSpecs.hpp
# Opt level: O1

void __thiscall sciplot::BorderSpecs::BorderSpecs(BorderSpecs *this)

{
  string local_48;
  
  *(undefined ***)&this->super_LineSpecsOf<sciplot::BorderSpecs> = &PTR__LineSpecsOf_001a5698;
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linestyle._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linestyle.field_2;
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linestyle._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linestyle.field_2._M_local_buf[0] = '\0';
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linetype._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linetype.field_2;
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linetype._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linetype.field_2._M_local_buf[0] = '\0';
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linewidth._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linewidth.field_2;
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linewidth._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linewidth.field_2._M_local_buf[0] = '\0';
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linecolor._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linecolor.field_2;
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linecolor._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_linecolor.field_2._M_local_buf[0] = '\0';
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_dashtype._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::BorderSpecs>).m_dashtype.field_2;
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_dashtype._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::BorderSpecs>).m_dashtype.field_2._M_local_buf[0] = '\0';
  DepthSpecsOf<sciplot::BorderSpecs>::DepthSpecsOf
            (&this->super_DepthSpecsOf<sciplot::BorderSpecs>,&PTR_construction_vtable_40__001a5650);
  *(undefined ***)&this->super_LineSpecsOf<sciplot::BorderSpecs> = &PTR__BorderSpecs_001a55e0;
  *(undefined ***)&this->super_DepthSpecsOf<sciplot::BorderSpecs> = &PTR__BorderSpecs_001a5620;
  (this->m_depth)._M_dataplus._M_p = (pointer)&(this->m_depth).field_2;
  (this->m_depth)._M_string_length = 0;
  (this->m_depth).field_2._M_local_buf[0] = '\0';
  (this->m_encoding).super__Base_bitset<1UL>._M_w = 3;
  LineSpecsOf<sciplot::BorderSpecs>::lineType(&this->super_LineSpecsOf<sciplot::BorderSpecs>,1);
  LineSpecsOf<sciplot::BorderSpecs>::lineWidth(&this->super_LineSpecsOf<sciplot::BorderSpecs>,2);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"#404040","");
  LineSpecsOf<sciplot::BorderSpecs>::lineColor
            (&this->super_LineSpecsOf<sciplot::BorderSpecs>,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_DepthSpecsOf<sciplot::BorderSpecs>).m_depth,0,
             (char *)(this->super_DepthSpecsOf<sciplot::BorderSpecs>).m_depth._M_string_length,
             0x18e470);
  return;
}

Assistant:

inline BorderSpecs::BorderSpecs()
{
    left();
    bottom();
    lineType(internal::DEFAULT_BORDER_LINETYPE);
    lineWidth(internal::DEFAULT_BORDER_LINEWIDTH);
    lineColor(internal::DEFAULT_BORDER_LINECOLOR);
    front();
}